

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_4ffb8::RegexExpr<wchar_t>::~RegexExpr(RegexExpr<wchar_t> *this)

{
  ~RegexExpr(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}